

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O3

unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
* __thiscall packing::AssignedProtos::uniqueColors(AssignedProtos *this)

{
  pointer poVar1;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *in_R9;
  Iter<__gnu_cxx::__normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::add_const_t>
  iter;
  AssignedProtos *local_20;
  pointer local_18;
  
  if (uniqueColors()::colors == '\0') {
    uniqueColors();
  }
  std::
  _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&uniqueColors::colors._M_h);
  poVar1 = (this->_assigned).
           super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_18 = (this->_assigned).
             super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while ((poVar1 != local_18 &&
         ((poVar1->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
          super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
          super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false))) {
    poVar1 = poVar1 + 1;
  }
  iter._iter._M_current = (optional<packing::ProtoPalAttrs> *)&local_20;
  iter._array = (add_const_t<decltype(_assigned)> *)poVar1;
  local_20 = this;
  addUniqueColors<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::add_const_t>>
            ((AssignedProtos *)&uniqueColors::colors,
             (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
              *)this,iter,
             (Iter<__gnu_cxx::__normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::add_const_t>
              *)this->_protoPals,in_R9);
  return &uniqueColors::colors;
}

Assistant:

std::unordered_set<uint16_t> &uniqueColors() const {
		// We check for *distinct* colors by stuffing them into a `set`; this should be
		// faster than "back-checking" on every element (O(n²))
		//
		// TODO: calc84maniac suggested another approach; try implementing it, see if it
		// performs better:
		// > So basically you make a priority queue that takes iterators into each of your sets
		// > (paired with end iterators so you'll know where to stop), and the comparator tests the
		// > values pointed to by each iterator
		// > Then each iteration you pop from the queue,
		// > optionally add one to your count, increment the iterator and push it back into the
		// > queue if it didn't reach the end
		// > And you do this until the priority queue is empty
		static std::unordered_set<uint16_t> colors;

		colors.clear();
		addUniqueColors(colors, begin(), end(), *_protoPals);
		return colors;
	}